

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dnn.cpp
# Opt level: O0

void __thiscall tfs::Dnn::clear(Dnn *this)

{
  bool bVar1;
  reference ppDVar2;
  __normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
  *in_RDI;
  DnnLayer *layer;
  const_iterator it;
  const_iterator layer_end;
  DnnLayer *in_stack_ffffffffffffffb8;
  __normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
  local_20;
  DnnLayer **local_18;
  
  in_RDI[4]._M_current = (DnnLayer **)0x0;
  in_RDI[5]._M_current = (DnnLayer **)0x0;
  in_RDI[6]._M_current = (DnnLayer **)0x0;
  local_18 = (DnnLayer **)
             std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>::end
                       ((vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_> *)
                        in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<tfs::DnnLayer*const*,std::vector<tfs::DnnLayer*,std::allocator<tfs::DnnLayer*>>>
  ::__normal_iterator<tfs::DnnLayer**>
            (in_RDI,(__normal_iterator<tfs::DnnLayer_**,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
                     *)in_stack_ffffffffffffffb8);
  std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>::begin
            ((vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_> *)in_stack_ffffffffffffffb8)
  ;
  __gnu_cxx::
  __normal_iterator<tfs::DnnLayer*const*,std::vector<tfs::DnnLayer*,std::allocator<tfs::DnnLayer*>>>
  ::__normal_iterator<tfs::DnnLayer**>
            (in_RDI,(__normal_iterator<tfs::DnnLayer_**,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
                     *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffb8 = *ppDVar2;
    if (in_stack_ffffffffffffffb8 != (DnnLayer *)0x0) {
      (*in_stack_ffffffffffffffb8->_vptr_DnnLayer[1])();
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<tfs::DnnLayer_*const_*,_std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>_>
         ::operator++(in_stack_ffffffffffffffc8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  std::vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>::clear
            ((vector<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_> *)0x11c6cd);
  return;
}

Assistant:

void
    Dnn::clear( void ) {
        // Delete all of the layers.
        m_layer_input    = 0;
        m_layer_previous = 0;
        m_layer_output   = 0;
        std::vector< DnnLayer* >::const_iterator layer_end = m_layers.end();
        for( std::vector< DnnLayer* >::const_iterator it = m_layers.begin(); it != layer_end; it++ ) {
            DnnLayer *layer = *it;
            delete layer;
        }
        m_layers.clear();
        return;
    }